

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionAnalysisEnvironment_getOrCreateCaptureFor
          (sysbvm_context_t *context,sysbvm_functionAnalysisEnvironment_t *environment,
          sysbvm_tuple_t sourceBinding)

{
  sysbvm_tuple_t ownerFunction;
  sysbvm_tuple_t capturedBinding_00;
  sysbvm_functionAnalysisEnvironment_t *context_00;
  _Bool _Var1;
  size_t vectorIndex;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t capturedBindingKey;
  sysbvm_symbolBinding_t *sourceBindingObject;
  sysbvm_tuple_t capturedBinding;
  sysbvm_tuple_t sourceBinding_local;
  sysbvm_functionAnalysisEnvironment_t *environment_local;
  sysbvm_context_t *context_local;
  
  local_48 = sourceBinding;
  if (*(long *)(sourceBinding + 0x10) != 0) {
    local_48 = *(sysbvm_tuple_t *)(sourceBinding + 0x10);
  }
  capturedBinding = sourceBinding;
  sourceBinding_local = (sysbvm_tuple_t)environment;
  environment_local = (sysbvm_functionAnalysisEnvironment_t *)context;
  _Var1 = sysbvm_identityDictionary_find
                    (environment->captureBindingTable,local_48,
                     (sysbvm_tuple_t *)&sourceBindingObject);
  context_00 = environment_local;
  capturedBinding_00 = capturedBinding;
  if (_Var1) {
    context_local = (sysbvm_context_t *)sourceBindingObject;
  }
  else {
    ownerFunction = *(sysbvm_tuple_t *)(sourceBinding_local + 0x88);
    vectorIndex = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(sourceBinding_local + 0x98));
    sourceBindingObject =
         (sysbvm_symbolBinding_t *)
         sysbvm_symbolCaptureBinding_create
                   ((sysbvm_context_t *)context_00,capturedBinding_00,ownerFunction,vectorIndex);
    sysbvm_identityDictionary_atPut
              ((sysbvm_context_t *)environment_local,*(sysbvm_tuple_t *)(sourceBinding_local + 0x90)
               ,local_48,(sysbvm_tuple_t)sourceBindingObject);
    sysbvm_orderedCollection_add
              ((sysbvm_context_t *)environment_local,*(sysbvm_tuple_t *)(sourceBinding_local + 0x98)
               ,(sysbvm_tuple_t)sourceBindingObject);
    context_local = (sysbvm_context_t *)sourceBindingObject;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionAnalysisEnvironment_getOrCreateCaptureFor(sysbvm_context_t *context, sysbvm_functionAnalysisEnvironment_t *environment, sysbvm_tuple_t sourceBinding)
{
    sysbvm_tuple_t capturedBinding;
    sysbvm_symbolBinding_t *sourceBindingObject = (sysbvm_symbolBinding_t*)sourceBinding;
    sysbvm_tuple_t capturedBindingKey = sourceBindingObject->super.name ? sourceBindingObject->super.name : sourceBinding;
    if(sysbvm_identityDictionary_find(environment->captureBindingTable, capturedBindingKey, &capturedBinding))
        return capturedBinding;

    capturedBinding = sysbvm_symbolCaptureBinding_create(context, sourceBinding, environment->functionDefinition, sysbvm_orderedCollection_getSize(environment->captureBindingList));
    sysbvm_identityDictionary_atPut(context, environment->captureBindingTable, capturedBindingKey, capturedBinding);
    sysbvm_orderedCollection_add(context, environment->captureBindingList, capturedBinding);
    return capturedBinding;
}